

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_tIME(png_structrp png_ptr,png_const_timep mod_time)

{
  png_byte buf [7];
  png_byte local_f;
  undefined1 local_e;
  png_byte local_d;
  png_byte local_c;
  byte local_b;
  png_byte local_a;
  byte local_9;
  
  local_d = mod_time->month;
  if ((((0xf3 < (byte)(local_d - 0xd)) && (local_c = mod_time->day, 0xe0 < (byte)(local_c - 0x20)))
      && (local_b = mod_time->hour, local_b < 0x18)) && (local_9 = mod_time->second, local_9 < 0x3d)
     ) {
    local_f = (png_byte)(mod_time->year >> 8);
    local_e = (undefined1)mod_time->year;
    local_a = mod_time->minute;
    png_write_complete_chunk(png_ptr,0x74494d45,&local_f,7);
    return;
  }
  png_warning(png_ptr,"Invalid time specified for tIME chunk");
  return;
}

Assistant:

void /* PRIVATE */
png_write_tIME(png_structrp png_ptr, png_const_timep mod_time)
{
   png_byte buf[7];

   png_debug(1, "in png_write_tIME");

   if (mod_time->month  > 12 || mod_time->month  < 1 ||
       mod_time->day    > 31 || mod_time->day    < 1 ||
       mod_time->hour   > 23 || mod_time->second > 60)
   {
      png_warning(png_ptr, "Invalid time specified for tIME chunk");
      return;
   }

   png_save_uint_16(buf, mod_time->year);
   buf[2] = mod_time->month;
   buf[3] = mod_time->day;
   buf[4] = mod_time->hour;
   buf[5] = mod_time->minute;
   buf[6] = mod_time->second;

   png_write_complete_chunk(png_ptr, png_tIME, buf, (png_size_t)7);
}